

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

String * __thiscall
kj::encodeUriComponent(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> bytes)

{
  kj kVar1;
  uchar *puVar2;
  size_t sVar3;
  uchar *puVar4;
  Vector<char> local_58;
  String *local_38;
  
  puVar2 = bytes.ptr;
  local_38 = __return_storage_ptr__;
  local_58.builder.pos =
       (RemoveConst<char> *)
       _::HeapArrayDisposer::allocateImpl
                 (1,0,(size_t)(puVar2 + 1),(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = (char *)((kj *)local_58.builder.pos + (long)puVar2 + 1);
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.builder.ptr = local_58.builder.pos;
  if (puVar2 != (uchar *)0x0) {
    puVar4 = (uchar *)0x0;
    do {
      kVar1 = this[(long)puVar4];
      if (((((byte)((char)kVar1 - 0x30U) < 10) || ((byte)(((byte)kVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          (((byte)kVar1 - 0x21 < 0x3f &&
           ((0x40000000000033c1U >> ((ulong)((byte)kVar1 - 0x21) & 0x3f) & 1) != 0)))) ||
         (kVar1 == (kj)0x7e)) {
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar3 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar3 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar3);
        }
        *local_58.builder.pos = (RemoveConst<char>)kVar1;
      }
      else {
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar3 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar3 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar3);
        }
        *local_58.builder.pos = '%';
        local_58.builder.pos = local_58.builder.pos + 1;
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar3 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar3 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar3);
        }
        *local_58.builder.pos = (RemoveConst<char>)*(kj *)("0123456789ABCDEF" + ((byte)kVar1 >> 4));
        local_58.builder.pos = local_58.builder.pos + 1;
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar3 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar3 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar3);
        }
        *local_58.builder.pos = (RemoveConst<char>)*(kj *)("0123456789ABCDEF" + ((byte)kVar1 & 0xf))
        ;
      }
      local_58.builder.pos = local_58.builder.pos + 1;
      puVar4 = puVar4 + 1;
    } while (puVar2 != puVar4);
  }
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar3 = 4;
    if (local_58.builder.endPtr != local_58.builder.ptr) {
      sVar3 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_58,sVar3);
  }
  *local_58.builder.pos = '\0';
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (local_38->content).ptr = local_58.builder.ptr;
  (local_38->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (local_38->content).disposer = local_58.builder.disposer;
  return local_38;
}

Assistant:

String encodeUriComponent(ArrayPtr<const byte> bytes) {
  Vector<char> result(bytes.size() + 1);
  for (byte b: bytes) {
    if (('A' <= b && b <= 'Z') ||
        ('a' <= b && b <= 'z') ||
        ('0' <= b && b <= '9') ||
        b == '-' || b == '_' || b == '.' || b == '!' || b == '~' || b == '*' || b == '\'' ||
        b == '(' || b == ')') {
      result.add(b);
    } else {
      result.add('%');
      result.add(HEX_DIGITS_URI[b/16]);
      result.add(HEX_DIGITS_URI[b%16]);
    }
  }
  result.add('\0');
  return String(result.releaseAsArray());
}